

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.pb.cc
# Opt level: O2

void google::protobuf::Any::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  string *psVar1;
  Arena *pAVar2;
  Any *_this;
  Any *local_20;
  Any *local_18 [2];
  
  local_20 = (Any *)to_msg;
  local_18[0] = (Any *)from_msg;
  psVar1 = absl::lts_20240722::log_internal::
           Check_NEImpl<google::protobuf::Any_const*,google::protobuf::Any*>
                     (local_18,&local_20,"&from != _this");
  if (psVar1 == (string *)0x0) {
    psVar1 = (string *)((ulong)from_msg[1]._vptr_MessageLite & 0xfffffffffffffffc);
    if (psVar1->_M_string_length != 0) {
      pAVar2 = (Arena *)(local_20->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar2 & 1) != 0) {
        pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>(&(local_20->field_0)._impl_.type_url_,psVar1,pAVar2);
    }
    psVar1 = (string *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if (psVar1->_M_string_length != 0) {
      pAVar2 = (Arena *)(local_20->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar2 & 1) != 0) {
        pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>(&(local_20->field_0)._impl_.value_,psVar1,pAVar2);
    }
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_20->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/any.pb.cc"
             ,0x161,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

void Any::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Any*>(&to_msg);
  auto& from = static_cast<const Any&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Any)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_type_url().empty()) {
    _this->_internal_set_type_url(from._internal_type_url());
  }
  if (!from._internal_value().empty()) {
    _this->_internal_set_value(from._internal_value());
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}